

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O0

void media_player2_player_skeleton_dbus_interface_flush(GDBusInterfaceSkeleton *_skeleton)

{
  GType GVar1;
  gpointer user_data;
  bool bVar2;
  gboolean emit_changed;
  MediaPlayer2PlayerSkeleton *skeleton;
  GDBusInterfaceSkeleton *_skeleton_local;
  
  GVar1 = media_player2_player_skeleton_get_type();
  user_data = (gpointer)g_type_check_instance_cast(_skeleton,GVar1);
  g_mutex_lock(*(long *)((long)user_data + 0x20) + 0x20);
  bVar2 = *(long *)(*(long *)((long)user_data + 0x20) + 0x10) != 0;
  if (bVar2) {
    g_source_destroy(*(undefined8 *)(*(long *)((long)user_data + 0x20) + 0x10));
    *(undefined8 *)(*(long *)((long)user_data + 0x20) + 0x10) = 0;
  }
  g_mutex_unlock(*(long *)((long)user_data + 0x20) + 0x20);
  if (bVar2) {
    _media_player2_player_emit_changed(user_data);
  }
  return;
}

Assistant:

static void
media_player2_player_skeleton_dbus_interface_flush (GDBusInterfaceSkeleton *_skeleton)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (_skeleton);
  gboolean emit_changed = FALSE;

  g_mutex_lock (&skeleton->priv->lock);
  if (skeleton->priv->changed_properties_idle_source != NULL)
    {
      g_source_destroy (skeleton->priv->changed_properties_idle_source);
      skeleton->priv->changed_properties_idle_source = NULL;
      emit_changed = TRUE;
    }
  g_mutex_unlock (&skeleton->priv->lock);

  if (emit_changed)
    _media_player2_player_emit_changed (skeleton);
}